

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

void anon_unknown.dwarf_11255e::ReportAt
               (ExpressionContext *ctx,SynBase *source,char *pos,char *msg,__va_list_tag *args)

{
  SmallArray<ErrorInfo_*,_4U> *this;
  char *pcVar1;
  Allocator *pAVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  undefined4 extraout_var;
  char *pcVar10;
  ModuleData *pMVar11;
  ErrorInfo *pEVar9;
  
  pcVar10 = ctx->errorBuf;
  if ((pcVar10 != (char *)0x0) && (ctx->errorBufSize != 0)) {
    if (ctx->errorCount == 0) {
      ctx->errorPos = pos;
      ctx->errorBufLocation = pcVar10;
    }
    pcVar1 = ctx->errorBufLocation;
    vsnprintf(pcVar1,(ulong)(ctx->errorBufSize + ((int)pcVar10 - (int)pcVar1)),msg,args);
    ctx->errorBuf[ctx->errorBufSize - 1] = '\0';
    pcVar10 = ctx->errorBufLocation;
    pcVar7 = strstr(pcVar10,"%error-type%");
    if (pcVar7 != (char *)0x0) {
      __assert_fail("strstr(ctx.errorBufLocation, \"%error-type%\") == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x48,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
    sVar8 = strlen(pcVar10);
    ctx->errorBufLocation = pcVar10 + sVar8;
    this = &ctx->errorInfo;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar9 = (ErrorInfo *)CONCAT44(extraout_var,iVar5);
    pAVar2 = ctx->allocator;
    pLVar3 = source->begin;
    pLVar4 = source->end;
    pEVar9->messageStart = pcVar1;
    pEVar9->messageEnd = pcVar10 + sVar8;
    pEVar9->begin = pLVar3;
    pEVar9->end = pLVar4;
    pEVar9->pos = pos;
    (pEVar9->related).allocator = pAVar2;
    (pEVar9->related).data = (pEVar9->related).little;
    (pEVar9->related).count = 0;
    (pEVar9->related).max = 4;
    pEVar9->parentModule = (ModuleData *)0x0;
    uVar6 = (ctx->errorInfo).count;
    if (uVar6 == (ctx->errorInfo).max) {
      SmallArray<ErrorInfo_*,_4U>::grow(this,uVar6);
    }
    if (this->data == (ErrorInfo **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]"
                   );
    }
    uVar6 = (ctx->errorInfo).count;
    (ctx->errorInfo).count = uVar6 + 1;
    this->data[uVar6] = pEVar9;
    pcVar10 = FindModuleCodeWithSourceLocation(ctx,pos);
    if (pcVar10 != (char *)0x0) {
      AddErrorLocationInfo
                (pcVar10,pos,ctx->errorBufLocation,
                 (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
      pcVar1 = ctx->errorBufLocation;
      sVar8 = strlen(pcVar1);
      ctx->errorBufLocation = pcVar1 + sVar8;
      if (pcVar10 != ctx->code) {
        pMVar11 = FindModuleWithSourceLocation(ctx,(source->pos).begin);
        if (pMVar11 != (ModuleData *)0x0) {
          NULLC::SafeSprintf(ctx->errorBufLocation,
                             (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                                    ctx->errorBufSize)," [in module \'%.*s\']\n",
                             (ulong)(uint)(*(int *)&(pMVar11->name).end - (int)(pMVar11->name).begin
                                          ));
          pcVar10 = ctx->errorBufLocation;
          sVar8 = strlen(pcVar10);
          ctx->errorBufLocation = pcVar10 + sVar8;
          uVar6 = (ctx->errorInfo).count;
          if (uVar6 == 0) {
            __assert_fail("count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x172,"T &SmallArray<ErrorInfo *, 4>::back() [T = ErrorInfo *, N = 4]");
          }
          this->data[uVar6 - 1]->parentModule = pMVar11;
        }
      }
    }
  }
  if (ctx->errorHandlerNested == true) {
    if (ctx->errorHandlerActive == false) {
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x68,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
  }
  else {
    uVar6 = ctx->errorCount + 1;
    ctx->errorCount = uVar6;
    if (uVar6 != 100) {
      return;
    }
    NULLC::SafeSprintf(ctx->errorBufLocation,
                       (ulong)((*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) +
                              ctx->errorBufSize),"ERROR: error limit reached");
    pcVar10 = ctx->errorBufLocation;
    sVar8 = strlen(pcVar10);
    ctx->errorBufLocation = pcVar10 + sVar8;
    if (ctx->errorHandlerActive == false) {
      __assert_fail("ctx.errorHandlerActive",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x75,
                    "void (anonymous namespace)::ReportAt(ExpressionContext &, SynBase *, const char *, const char *, __va_list_tag *)"
                   );
    }
  }
  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
}

Assistant:

void ReportAt(ExpressionContext &ctx, SynBase *source, const char *pos, const char *msg, va_list args)
	{
		if(ctx.errorBuf && ctx.errorBufSize)
		{
			if(ctx.errorCount == 0)
			{
				ctx.errorPos = pos;
				ctx.errorBufLocation = ctx.errorBuf;
			}

			const char *messageStart = ctx.errorBufLocation;

			vsnprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), msg, args);
			ctx.errorBuf[ctx.errorBufSize - 1] = '\0';

			// Shouldn't report errors that are caused by error recovery
			assert(strstr(ctx.errorBufLocation, "%error-type%") == NULL);

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			const char *messageEnd = ctx.errorBufLocation;

			ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, source->begin, source->end, pos));

			if(const char *code = FindModuleCodeWithSourceLocation(ctx, pos))
			{
				AddErrorLocationInfo(code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				if(code != ctx.code)
				{
					ModuleData *parentModule = FindModuleWithSourceLocation(ctx, source->pos.begin);

					if(parentModule)
					{
						NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), " [in module '%.*s']\n", FMT_ISTR(parentModule->name));

						ctx.errorBufLocation += strlen(ctx.errorBufLocation);

						ctx.errorInfo.back()->parentModule = parentModule;
					}
				}
			}
		}

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		if(ctx.errorCount == 100)
		{
			NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: error limit reached");

			ctx.errorBufLocation += strlen(ctx.errorBufLocation);

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}